

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_readonly(sqlite3 *db,char *zDbName)

{
  Btree *pBVar1;
  uint uVar2;
  
  if (zDbName == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = sqlite3FindDbName(db,zDbName);
    if ((int)uVar2 < 0) {
      return -1;
    }
  }
  pBVar1 = db->aDb[uVar2].pBt;
  if (pBVar1 == (Btree *)0x0) {
    return -1;
  }
  return pBVar1->pBt->btsFlags & 1;
}

Assistant:

SQLITE_API int sqlite3_db_readonly(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeIsReadonly(pBt) : -1;
}